

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

JsonMappingApi * __thiscall
cfd::js::api::json::JsonMappingApi::AddMultisigSign(JsonMappingApi *this,string *request_message)

{
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
  local_58;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
  local_38;
  string *local_18;
  string *request_message_local;
  
  local_18 = request_message;
  request_message_local = (string *)this;
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddMultisigSignRequestStruct_const&)>
  ::
  function<cfd::js::api::RawTransactionResponseStruct(&)(cfd::js::api::AddMultisigSignRequestStruct_const&),void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddMultisigSignRequestStruct_const&)>
              *)&local_38,TransactionStructApi::AddMultisigSign);
  std::
  function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddMultisigSignRequestStruct_const&)>
  ::
  function<cfd::js::api::RawTransactionResponseStruct(&)(cfd::js::api::AddMultisigSignRequestStruct_const&),void>
            ((function<cfd::js::api::RawTransactionResponseStruct(cfd::js::api::AddMultisigSignRequestStruct_const&)>
              *)&local_58,ElementsTransactionStructApi::AddMultisigSign);
  ExecuteElementsCheckApi<cfd::js::api::json::AddMultisigSignRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::AddMultisigSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
            ((json *)this,request_message,&local_38,&local_58);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
  ::~function(&local_58);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddMultisigSignRequestStruct_&)>
  ::~function(&local_38);
  return this;
}

Assistant:

std::string JsonMappingApi::AddMultisigSign(
    const std::string &request_message) {
  return ExecuteElementsCheckApi<
      api::json::AddMultisigSignRequest, api::json::RawTransactionResponse,
      api::AddMultisigSignRequestStruct, api::RawTransactionResponseStruct>(
      request_message, TransactionStructApi::AddMultisigSign,
#ifndef CFD_DISABLE_ELEMENTS
      ElementsTransactionStructApi::AddMultisigSign);
#else
      TransactionStructApi::AddMultisigSign);
#endif
}